

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void text_drawborder(t_text *x,_glist *glist,char *tag,int width2,int height2,int firsttime)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  _glist *p_Var5;
  int iVar6;
  undefined8 in_stack_fffffffffffffcd8;
  undefined4 uVar8;
  undefined8 uVar7;
  undefined8 in_stack_fffffffffffffcf0;
  undefined4 uVar9;
  undefined8 in_stack_fffffffffffffd00;
  undefined4 uVar10;
  undefined8 in_stack_fffffffffffffd20;
  undefined4 uVar11;
  undefined8 in_stack_fffffffffffffd28;
  undefined4 uVar12;
  undefined8 in_stack_fffffffffffffd30;
  undefined4 uVar13;
  undefined8 in_stack_fffffffffffffd48;
  undefined4 uVar14;
  undefined8 in_stack_fffffffffffffd58;
  undefined4 uVar15;
  char **local_188;
  char *tags_4 [2];
  char *tags_3 [2];
  int y1p_1;
  int x1p_1;
  int grabbed_1;
  char *tags_2 [2];
  int y1p;
  int x1p;
  int grabbed;
  char *tags_1 [2];
  char *tags [2];
  char *pattern;
  char tagR [128];
  int local_7c;
  int corner;
  int height;
  int width;
  int y2;
  int x2;
  int y1;
  int x1;
  t_object *ob;
  int local_50;
  int firsttime_local;
  int height2_local;
  int width2_local;
  char *tag_local;
  _glist *glist_local;
  t_text *x_local;
  
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  uVar15 = (undefined4)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffd00 >> 0x20);
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  ob._4_4_ = firsttime;
  local_50 = height2;
  firsttime_local = width2;
  _height2_local = tag;
  tag_local = (char *)glist;
  glist_local = (_glist *)x;
  sprintf((char *)&pattern,"%sR",tag);
  text_getrect((t_gobj *)glist_local,(_glist *)tag_local,&x2,&y2,&width,&height);
  if (((glist_local->gl_obj).field_0x2e & 3) == 1) {
    pcVar4 = "\"\"";
    if ((glist_local->gl_obj).te_g.g_pd == text_class) {
      pcVar4 = "-";
    }
    tags_1[1] = (char *)&pattern;
    if (ob._4_4_ == 0) {
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crs iiiiiiiiii",p_Var5,"coords",&pattern,(ulong)(uint)x2,
                  CONCAT44(uVar8,y2),width,y2,CONCAT44(uVar9,width),height,CONCAT44(uVar10,x2),
                  height,x2,y2);
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crs rr",p_Var5,"itemconfigure",&pattern,"-dash",pcVar4);
    }
    else {
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crr iiiiiiiiii rr ri rr rS",p_Var5,"create","line",(ulong)(uint)x2,
                  CONCAT44(uVar8,y2),width,y2,CONCAT44(uVar9,width),height,CONCAT44(uVar10,x2),
                  height,x2,y2,"-dash",pcVar4,"-width",*(undefined4 *)(tag_local + 0xec),"-capstyle"
                  ,"projecting","-tags",CONCAT44(uVar15,2),tags_1 + 1);
    }
  }
  else if (((glist_local->gl_obj).field_0x2e & 3) == 2) {
    _x1p = &pattern;
    tags_1[0] = "msg";
    local_7c = (height - y2) / 4;
    iVar6 = *(int *)(tag_local + 0xec) * 10;
    if (local_7c != iVar6 &&
        SBORROW4(local_7c,iVar6) == local_7c + *(int *)(tag_local + 0xec) * -10 < 0) {
      local_7c = *(int *)(tag_local + 0xec) * 10;
    }
    if (ob._4_4_ == 0) {
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiiiii",p_Var5,"coords",&pattern,(ulong)(uint)x2,
                  CONCAT44(uVar8,y2),width + local_7c,y2,CONCAT44(uVar9,width),y2 + local_7c,
                  CONCAT44(uVar10,width),height - local_7c,width + local_7c,height,
                  CONCAT44(uVar11,x2),CONCAT44(uVar12,height),CONCAT44(uVar13,x2),y2);
    }
    else {
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crr iiiiiiiiiiiiii ri rr rS",p_Var5,"create","line",(ulong)(uint)x2,
                  CONCAT44(uVar8,y2),width + local_7c,y2,CONCAT44(uVar9,width),y2 + local_7c,
                  CONCAT44(uVar10,width),height - local_7c,width + local_7c,height,
                  CONCAT44(uVar11,x2),CONCAT44(uVar12,height),CONCAT44(uVar13,x2),y2,"-width",
                  CONCAT44(uVar14,*(undefined4 *)(tag_local + 0xec)),"-capstyle","projecting",
                  "-tags",2,&x1p);
    }
  }
  else if ((((glist_local->gl_obj).field_0x2e & 3) == 3) &&
          ((*(int *)&glist_local->gl_list == 1 || (*(int *)&glist_local->gl_list == 2)))) {
    iVar6 = *(int *)(tag_local + 0xec) * (uint)((byte)glist_local->gl_xmargin >> 3 & 1);
    uVar1 = x2 + iVar6;
    tags_2[1]._4_4_ = y2 + iVar6;
    _x1p_1 = &pattern;
    tags_2[0] = "atom";
    iVar2 = (height - y2) / 4;
    if (ob._4_4_ == 0) {
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      uVar7 = CONCAT44(uVar8,tags_2[1]._4_4_);
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiii",p_Var5,"coords",&pattern,(ulong)uVar1,uVar7,
                  width - iVar2,tags_2[1]._4_4_,CONCAT44(uVar9,width),tags_2[1]._4_4_ + iVar2,
                  CONCAT44(uVar10,width),height,uVar1,height,CONCAT44(uVar11,uVar1),
                  CONCAT44(uVar12,tags_2[1]._4_4_));
      uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crs ri",p_Var5,"itemconfigure",&pattern,"-width",
                  CONCAT44(uVar8,*(int *)(tag_local + 0xec) + iVar6));
    }
    else {
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crr iiiiiiiiiiii ri rr rS",p_Var5,"create","line",(ulong)uVar1,
                  CONCAT44(uVar8,tags_2[1]._4_4_),width - iVar2,tags_2[1]._4_4_,
                  CONCAT44(uVar9,width),tags_2[1]._4_4_ + iVar2,CONCAT44(uVar10,width),height,uVar1,
                  height,CONCAT44(uVar11,uVar1),CONCAT44(uVar12,tags_2[1]._4_4_),"-width",
                  *(int *)(tag_local + 0xec) + iVar6,"-capstyle","projecting","-tags",
                  CONCAT44(uVar15,2),&x1p_1);
    }
  }
  else if (((glist_local->gl_obj).field_0x2e & 3) == 3) {
    iVar6 = *(int *)(tag_local + 0xec) * (uint)((byte)glist_local->gl_xmargin >> 3 & 1);
    uVar1 = x2 + iVar6;
    iVar2 = y2 + iVar6;
    tags_4[1] = (char *)&pattern;
    iVar3 = (height - y2) / 4;
    if (ob._4_4_ == 0) {
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      uVar7 = CONCAT44(uVar8,iVar2);
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiiiii",p_Var5,"coords",&pattern,(ulong)uVar1,uVar7,
                  width - iVar3,iVar2,CONCAT44(uVar9,width),iVar2 + iVar3,CONCAT44(uVar10,width),
                  height - iVar3,width - iVar3,height,CONCAT44(uVar11,uVar1),CONCAT44(uVar12,height)
                  ,CONCAT44(uVar13,uVar1),iVar2);
      uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crs ri",p_Var5,"itemconfigure",&pattern,"-width",
                  CONCAT44(uVar8,*(int *)(tag_local + 0xec) + iVar6));
    }
    else {
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crr iiiiiiiiiiiiii ri rr rS",p_Var5,"create","line",(ulong)uVar1,
                  CONCAT44(uVar8,iVar2),width - iVar3,iVar2,CONCAT44(uVar9,width),iVar2 + iVar3,
                  CONCAT44(uVar10,width),height - iVar3,width - iVar3,height,CONCAT44(uVar11,uVar1),
                  CONCAT44(uVar12,height),CONCAT44(uVar13,uVar1),iVar2,"-width",
                  CONCAT44(uVar14,*(int *)(tag_local + 0xec) + iVar6),"-capstyle","projecting",
                  "-tags",2,tags_4 + 1);
    }
  }
  else if ((((glist_local->gl_obj).field_0x2e & 3) == 0) &&
          ((*(ushort *)(tag_local + 0xe8) >> 5 & 1) != 0)) {
    local_188 = &pattern;
    tags_4[0] = "commentbar";
    if (ob._4_4_ == 0) {
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crs iiii",p_Var5,"coords",&pattern,(ulong)(uint)width,
                  CONCAT44(uVar8,y2),width,height);
    }
    else {
      p_Var5 = glist_getcanvas((_glist *)tag_local);
      pdgui_vmess((char *)0x0,"crr iiii rS",p_Var5,"create","line",(ulong)(uint)width,
                  CONCAT44(uVar8,y2),width,height,"-tags",2,&local_188);
    }
  }
  _y1 = pd_checkobject((t_pd *)glist_local);
  if (_y1 != (t_object *)0x0) {
    glist_drawiofor((_glist *)tag_local,_y1,ob._4_4_,_height2_local,x2,y2,width,height);
  }
  if (ob._4_4_ != 0) {
    p_Var5 = glist_getcanvas((_glist *)tag_local);
    pdgui_vmess((char *)0x0,"crr",p_Var5,"raise","cord");
  }
  return;
}

Assistant:

void text_drawborder(t_text *x, t_glist *glist,
    const char *tag, int width2, int height2, int firsttime)
{
    t_object *ob;
    int x1, y1, x2, y2, width, height, corner;
    char tagR[128];
    sprintf(tagR, "%sR", tag);
    text_getrect(&x->te_g, glist, &x1, &y1, &x2, &y2);
    width = x2 - x1;
    height = y2 - y1;
    if (x->te_type == T_OBJECT)
    {
        char *pattern = ((pd_class(&x->te_pd) == text_class) ? "-" : "\"\"");
        char *tags[] = {tagR, "obj"};
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiii rr ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1, y1,  x2, y1,  x2, y2,  x1, y2,  x1, y1,
                "-dash", pattern,
                "-width", glist->gl_zoom,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1, y1,  x2, y1,  x2, y2,  x1, y2,  x1, y1);
            pdgui_vmess(0, "crs rr",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-dash", pattern);
        }
    }
    else if (x->te_type == T_MESSAGE)
    {
        char *tags[] = {tagR, "msg"};
        corner = ((y2-y1)/4);
        if (corner > 10*glist->gl_zoom)
            corner = 10*glist->gl_zoom; /* looks bad if too big */
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1, y1,  x2+corner, y1,  x2, y1+corner,  x2, y2-corner,  x2+corner, y2,  x1, y2,  x1, y1,
                "-width", glist->gl_zoom,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
            pdgui_vmess(0, "crs iiiiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1, y1,  x2+corner, y1,  x2, y1+corner,  x2, y2-corner,  x2+corner, y2,  x1, y2,  x1, y1);
    }
    else if (x->te_type == T_ATOM && (((t_gatom *)x)->a_flavor == A_FLOAT ||
           ((t_gatom *)x)->a_flavor == A_SYMBOL))
    {
            /* number or symbol */
        int grabbed = glist->gl_zoom * ((t_gatom *)x)->a_grabbed;
        int x1p = x1 + grabbed, y1p = y1 + grabbed;
        char *tags[] = {tagR, "atom"};
        corner = ((y2-y1)/4);
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner, x2, y2,  x1p, y2,  x1p, y1p,
                "-width", glist->gl_zoom+grabbed,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner,  x2, y2,  x1p, y2,  x1p, y1p);
            pdgui_vmess(0, "crs ri",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-width", glist->gl_zoom+grabbed);
        }
    }
    else if (x->te_type == T_ATOM ) /* list (ATOM but not float or symbol) */
    {
        int grabbed = glist->gl_zoom * ((t_gatom *)x)->a_grabbed;
        int x1p = x1 + grabbed, y1p = y1 + grabbed;
        char *tags[] = {tagR, "atom"};
        corner = ((y2-y1)/4);
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist),
                "create", "line",
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner,  x2, y2-corner,  x2-corner, y2,  x1p, y2,  x1p, y1p,
                "-width", glist->gl_zoom+grabbed,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1p,y1p, x2-corner,y1p, x2,y1p+corner, x2,y2-corner, x2-corner,y2, x1p,y2, x1p,y1p);
            pdgui_vmess(0, "crs ri",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-width", glist->gl_zoom+grabbed);
        }
    }
        /* for comments, just draw a bar on RHS if unlocked; when a visible
        canvas is unlocked we have to call this anew on all comments, and when
        locked we erase them all via the annoying "commentbar" tag. */
    else if (x->te_type == T_TEXT && glist->gl_edit)
    {
        char *tags[] = {tagR, "commentbar"};
        if (firsttime)
            pdgui_vmess(0, "crr iiii rS",
                glist_getcanvas(glist), "create", "line",
                x2, y1,  x2, y2,
                "-tags", 2, tags);
        else
            pdgui_vmess(0, "crs iiii",
                glist_getcanvas(glist), "coords", tagR,
                x2, y1,  x2, y2);
    }
        /* draw inlets/outlets */

    if ((ob = pd_checkobject(&x->te_pd)))
        glist_drawiofor(glist, ob, firsttime, tag, x1, y1, x2, y2);
    if (firsttime) /* raise cords over everything else */
        pdgui_vmess(0, "crr", glist_getcanvas(glist), "raise", "cord");
}